

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_color_mode_copy(LodePNGColorMode *dest,LodePNGColorMode *source)

{
  void *pvVar1;
  void *in_RSI;
  void *in_RDI;
  
  lodepng_color_mode_cleanup((LodePNGColorMode *)0x161777);
  lodepng_memcpy(in_RDI,in_RSI,0x28);
  if (*(long *)((long)in_RSI + 8) != 0) {
    pvVar1 = lodepng_malloc(0x16179f);
    *(void **)((long)in_RDI + 8) = pvVar1;
    if ((*(long *)((long)in_RDI + 8) == 0) && (*(long *)((long)in_RSI + 0x10) != 0)) {
      return 0x53;
    }
    lodepng_memcpy(*(void **)((long)in_RDI + 8),*(void **)((long)in_RSI + 8),
                   *(long *)((long)in_RSI + 0x10) << 2);
  }
  return 0;
}

Assistant:

unsigned lodepng_color_mode_copy(LodePNGColorMode* dest, const LodePNGColorMode* source) {
  lodepng_color_mode_cleanup(dest);
  lodepng_memcpy(dest, source, sizeof(LodePNGColorMode));
  if (source->palette) {
    dest->palette = (unsigned char*)lodepng_malloc(1024);
    if (!dest->palette && source->palettesize) return 83; /*alloc fail*/
    lodepng_memcpy(dest->palette, source->palette, source->palettesize * 4);
  }
  return 0;
}